

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O1

void __thiscall
dynamicgraph::SignalPtr<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::SignalPtr
          (SignalPtr<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this,
          Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *ptr,string *name)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::Signal
            ((Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *)&this->field_0x28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this->_vptr_SignalPtr = (_func_int **)0x1359d8;
  *(undefined8 *)&this->field_0x28 = 0x135ba8;
  this->signalPtr = ptr;
  this->modeNoThrow = false;
  this->transmitAbstract = false;
  this->abstractTransmitter = (SignalBase<int> *)0x0;
  return;
}

Assistant:

SignalPtr(Signal<T, Time> *ptr, std::string name = "")
      : Signal<T, Time>(name),
        signalPtr(ptr),
        modeNoThrow(false),
        transmitAbstract(false),
        abstractTransmitter(NULL) {}